

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

int ON_GetSpanIndices(int order,int cv_count,double *knot,int *span_indices)

{
  int span_index;
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  iVar1 = 0;
  do {
    span_index = iVar1;
    span_indices[uVar2] = order + -2 + span_index;
    iVar1 = ON_NextNurbsSpanIndex(order,cv_count,knot,span_index);
    if (iVar1 < 0) {
      uVar2 = 0xffffffff;
      goto LAB_004c1a09;
    }
    uVar2 = uVar2 + 1;
  } while (span_index != iVar1);
  span_indices[uVar2 & 0xffffffff] = order + span_index + -1;
LAB_004c1a09:
  return (int)uVar2;
}

Assistant:

int ON_GetSpanIndices(int order, 
                            int cv_count, 
                            const double* knot, 
                            int* span_indices)

/* span_indices should have size greater than the number of 
   spans (cv_count is big enough).

  returns span count.
  fills in span_indices with index of last in each bunch of multiple knots at 
  start of span, and first in buch at end of nurb.


  */
{
  int span_index, next_span_index, j;

  span_index = -1;
  next_span_index = 0;
  j = 0;
  while (span_index != next_span_index) {
    span_index = next_span_index;
    span_indices[j] = span_index + order - 2;
    next_span_index = ON_NextNurbsSpanIndex(order, cv_count, knot, span_index);
    if (next_span_index < 0) 
      return next_span_index;
    j++;
  } 
  
  span_indices[j] = span_index + order - 1;

  return j;
}